

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O3

void cmd_init(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  wchar_t wVar5;
  long lVar6;
  cmd_info_conflict ***pppcVar7;
  cmd_info_conflict **ppcVar8;
  wchar_t wVar9;
  cmd_info_conflict *pcVar10;
  size_t sVar11;
  keycode_t kVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  
  memset(converted_list,0,0x1000);
  if (nested_lists != (cmd_info_conflict ***)0x0) {
    if (n_nested != L'\0') {
      uVar13 = 0;
      do {
        mem_free(nested_lists[uVar13]);
        uVar13 = uVar13 + 1;
      } while (uVar13 < (uint)n_nested);
    }
    nested_lists = (cmd_info_conflict ***)0x0;
  }
  uVar19 = 0;
  uVar21 = 0;
  uVar20 = 0;
  uVar18 = 0;
  lVar6 = 0;
  do {
    uVar1 = *(uint *)((long)&cmds_all[3].keymap + lVar6);
    uVar2 = *(uint *)((long)&cmds_all[2].keymap + lVar6);
    uVar3 = *(uint *)((long)&cmds_all[1].keymap + lVar6);
    uVar4 = *(uint *)((long)&cmds_all[0].keymap + lVar6);
    uVar14 = -(uint)((int)uVar4 < (int)uVar19);
    uVar15 = -(uint)((int)uVar3 < (int)uVar21);
    uVar16 = -(uint)((int)uVar2 < (int)uVar20);
    uVar17 = -(uint)((int)uVar1 < (int)uVar18);
    uVar19 = ~uVar14 & uVar4 | uVar19 & uVar14;
    uVar21 = ~uVar15 & uVar3 | uVar21 & uVar15;
    uVar20 = ~uVar16 & uVar2 | uVar20 & uVar16;
    uVar18 = ~uVar17 & uVar1 | uVar18 & uVar17;
    lVar6 = lVar6 + 0x80;
  } while (lVar6 != 0x200);
  uVar20 = ~-(uint)((int)uVar20 < (int)uVar19) & uVar20 |
           uVar19 & -(uint)((int)uVar20 < (int)uVar19);
  uVar21 = ~-(uint)((int)uVar18 < (int)uVar21) & uVar18 |
           uVar21 & -(uint)((int)uVar18 < (int)uVar21);
  uVar19 = -(uint)((int)uVar21 < (int)uVar20);
  n_nested = ~uVar19 & uVar21 | uVar20 & uVar19;
  pppcVar7 = (cmd_info_conflict ***)0x0;
  wVar9 = n_nested;
  if (L'\0' < n_nested) {
    pppcVar7 = (cmd_info_conflict ***)mem_zalloc((ulong)(uint)n_nested << 3);
    nested_lists = pppcVar7;
    if (n_nested == L'\0') {
      wVar9 = L'\0';
    }
    else {
      uVar13 = 0;
      do {
        ppcVar8 = (cmd_info_conflict **)mem_zalloc(0x800);
        pppcVar7 = nested_lists;
        nested_lists[uVar13] = ppcVar8;
        uVar13 = uVar13 + 1;
        wVar9 = n_nested;
      } while (uVar13 < (uint)n_nested);
    }
  }
  lVar6 = 0;
  do {
    pcVar10 = cmds_all[lVar6].list;
    wVar5 = cmds_all[lVar6].keymap;
    if ((ulong)(uint)wVar5 == 0) {
      for (sVar11 = cmds_all[lVar6].len; sVar11 != 0; sVar11 = sVar11 - 1) {
        uVar19 = pcVar10->key[0];
        kVar12 = pcVar10->key[1];
        if (pcVar10->key[1] == 0) {
          pcVar10->key[1] = uVar19;
          kVar12 = uVar19;
        }
        if (kVar12 != 0 && uVar19 != 0) {
          converted_list[0][uVar19] = pcVar10;
          converted_list[1][kVar12] = pcVar10;
        }
        pcVar10 = pcVar10 + 1;
      }
    }
    else if (L'\0' < wVar5) {
      if (wVar9 < wVar5) {
        __assert_fail("kidx < n_nested",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-game.c"
                      ,0x1a4,"void cmd_init(void)");
      }
      for (sVar11 = cmds_all[lVar6].len; sVar11 != 0; sVar11 = sVar11 - 1) {
        uVar19 = pcVar10->key[0];
        pcVar10->key[1] = uVar19;
        if (pppcVar7[(ulong)(uint)wVar5 - 1][uVar19] != (cmd_info_conflict *)0x0) {
          __assert_fail("!nested_lists[kidx][commands[i].key[0]]",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-game.c"
                        ,0x1b0,"void cmd_init(void)");
        }
        pppcVar7[(ulong)(uint)wVar5 - 1][uVar19] = pcVar10;
        pcVar10 = pcVar10 + 1;
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  return;
}

Assistant:

void cmd_init(void)
{
	size_t i, j;

	memset(converted_list, 0, sizeof(converted_list));

	/* Set up storage for the nested command lists */
	if (nested_lists != NULL) {
		assert(n_nested >= 0);
		for (j = 0; j < (size_t)n_nested; j++) {
			mem_free(nested_lists[j]);
		}
		nested_lists = NULL;
	}
	n_nested = 0;
	for (j = 0; j < N_ELEMENTS(cmds_all) - 1; j++) {
		n_nested = MAX(n_nested, cmds_all[j].keymap);
	}
	if (n_nested > 0) {
		nested_lists = mem_zalloc(n_nested * sizeof(*nested_lists));
		for (j = 0; j < (size_t)n_nested; j++) {
			nested_lists[j] = mem_zalloc((UCHAR_MAX + 1) *
				sizeof(*(nested_lists[j])));
		}
	}

	/* Go through all generic commands (-1 for NULL end entry) */
	for (j = 0; j < N_ELEMENTS(cmds_all) - 1; j++)
	{
		struct cmd_info *commands = cmds_all[j].list;

		/* Fill everything in */
		if (cmds_all[j].keymap == 0) {
			for (i = 0; i < cmds_all[j].len; i++) {
				/* If a roguelike key isn't set, use default */
				if (!commands[i].key[1])
					commands[i].key[1] = commands[i].key[0];

				/* Skip entries that don't have a valid key. */
				if (!commands[i].key[0] || !commands[i].key[1])
					continue;

				converted_list[0][commands[i].key[0]] =
					&commands[i];
				converted_list[1][commands[i].key[1]] =
					&commands[i];
			}
		} else if (cmds_all[j].keymap > 0) {
			int kidx = cmds_all[j].keymap - 1;

			assert(kidx < n_nested);
			for (i = 0; i < cmds_all[j].len; i++) {
				/*
				 * Nested commands don't go through a keymap;
				 * use the default for the roguelike key.
				 */
				commands[i].key[1] = commands[i].key[0];

				/*
				 * Check for duplicated keys in the same
				 * command set.
				 */
				assert(!nested_lists[kidx][commands[i].key[0]]);

				nested_lists[kidx][commands[i].key[0]] =
					&commands[i];
			}
		}
	}
}